

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_fetch_all(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  unqlite_col *pCol_00;
  jx9_value *pValue_00;
  jx9_value *pValue_01;
  jx9_int64 jVar2;
  jx9_value *pjStack_c8;
  int iResult;
  jx9_value *apArg [2];
  undefined1 local_b0 [8];
  jx9_value sResult;
  jx9_value *pCallback;
  jx9_value *pArray;
  jx9_value *pValue;
  int rc;
  int nByte;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  unqlite_col *pCol;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 1) {
    jx9_context_throw_error(pCtx,1,"Missing collection name");
    jx9_result_null(pCtx);
  }
  else {
    _rc = jx9_value_to_string(*argv,(int *)((long)&pValue + 4));
    if (pValue._4_4_ < 1) {
      jx9_context_throw_error(pCtx,1,"Invalid collection name");
      jx9_result_null(pCtx);
    }
    else {
      sName.zString._0_4_ = pValue._4_4_;
      sName._8_8_ = jx9_context_user_data(pCtx);
      pCol_00 = unqliteCollectionFetch((unqlite_vm *)sName._8_8_,(SyString *)&rc,4);
      if (pCol_00 == (unqlite_col *)0x0) {
        jx9_result_null(pCtx);
      }
      else {
        sResult.nIdx = 0;
        sResult._60_4_ = 0;
        pValue_00 = jx9_context_new_array(pCtx);
        pValue_01 = jx9_context_new_scalar(pCtx);
        jx9MemObjInit(pCtx->pVm,(jx9_value *)local_b0);
        if ((pValue_01 == (jx9_value *)0x0) || (pValue_00 == (jx9_value *)0x0)) {
          jx9_context_throw_error(pCtx,1,"Jx9 is running out of memory");
          jx9_result_null(pCtx);
        }
        else {
          if ((1 < argc) && (iVar1 = jx9_value_is_callable(argv[1]), iVar1 != 0)) {
            sResult._56_8_ = argv[1];
          }
          unqliteCollectionResetRecordCursor(pCol_00);
          while (iVar1 = unqliteCollectionFetchNextRecord(pCol_00,pValue_01), iVar1 == 0) {
            if (((sResult._56_8_ == 0) ||
                (pjStack_c8 = pValue_01,
                pValue._0_4_ = jx9VmCallUserFunction
                                         (pCtx->pVm,(jx9_value *)sResult._56_8_,1,
                                          &stack0xffffffffffffff38,(jx9_value *)local_b0),
                (sxi32)pValue != 0)) ||
               (iVar1 = jx9_value_to_bool((jx9_value *)local_b0), iVar1 != 0)) {
              jx9_array_add_elem(pValue_00,(jx9_value *)0x0,pValue_01);
              jx9_value_null(pValue_01);
            }
            else {
              jVar2 = unqliteCollectionCurrentRecordId(pCol_00);
              unqliteCollectionCacheRemoveRecord(pCol_00,jVar2 + -1);
            }
          }
          jx9MemObjRelease((jx9_value *)local_b0);
          jx9_result_value(pCtx,pValue_00);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_db_fetch_all(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		jx9_value *pValue,*pArray,*pCallback = 0;
		jx9_value sResult; /* Callback result */
		/* Allocate an empty scalar value and an empty JSON array */
		pArray = jx9_context_new_array(pCtx);
		pValue = jx9_context_new_scalar(pCtx);
		jx9MemObjInit(pCtx->pVm,&sResult);
		if( pValue == 0 || pArray == 0 ){
			jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Jx9 is running out of memory");
			jx9_result_null(pCtx);
			return JX9_OK;
		}
		if( argc > 1 && jx9_value_is_callable(argv[1]) ){
			pCallback = argv[1];
		}
		unqliteCollectionResetRecordCursor(pCol);
		/* Fetch collection records one after one */
		while( UNQLITE_OK == unqliteCollectionFetchNextRecord(pCol,pValue) ){
			if( pCallback ){
				jx9_value *apArg[2];
				/* Invoke the filter callback */
				apArg[0] = pValue;
				rc = jx9VmCallUserFunction(pCtx->pVm,pCallback,1,apArg,&sResult);
				if( rc == JX9_OK ){
					int iResult; /* Callback result */
					/* Extract callback result */
					iResult = jx9_value_to_bool(&sResult);
					if( !iResult ){
						/* Discard the result */
						unqliteCollectionCacheRemoveRecord(pCol,unqliteCollectionCurrentRecordId(pCol) - 1);
						continue;
					}
				}
			}
			/* Put the value in the JSON array */
			jx9_array_add_elem(pArray,0,pValue);
			/* Release the value */
			jx9_value_null(pValue);
		}
		jx9MemObjRelease(&sResult);
		/* Finally, return our array */
		jx9_result_value(pCtx,pArray);
		/* pValue will be automatically released as soon we return from
		 * this foreign function.
		 */
	}else{
		/* No such collection, return null */
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}